

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp_object.cpp
# Opt level: O1

void __thiscall
mjs::regexp_object::regexp_object
          (regexp_object *this,gc_heap_ptr<mjs::global_object> *global,object_ptr *prototype,
          string *source,regexp_flag flags)

{
  long *plVar1;
  gc_heap_ptr_untyped local_40;
  
  plVar1 = (long *)gc_heap_ptr_untyped::get(&global->super_gc_heap_ptr_untyped);
  (**(code **)(*plVar1 + 0x98))(&local_40,plVar1,"RegExp");
  native_object::native_object(&this->super_native_object,(string *)&local_40,prototype);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped(&local_40);
  (this->super_native_object).super_object._vptr_object = (_func_int **)&PTR_get_001d9ea8;
  *(uint32_t *)&(this->super_native_object).field_0x24 = (global->super_gc_heap_ptr_untyped).pos_;
  (this->source_).pos_ = (source->super_gc_heap_ptr<mjs::gc_string>).super_gc_heap_ptr_untyped.pos_;
  value_representation::value_representation(&this->last_index_,0.0);
  this->flags_ = flags;
  native_object::do_add_native_property
            (&this->super_native_object,"source",dont_delete|dont_enum|read_only,
             native_object::
             add_native_property<mjs::regexp_object,_&mjs::regexp_object::get_source,_nullptr>::
             anon_class_1_0_00000001::__invoke,(put_func)0x0);
  native_object::do_add_native_property
            (&this->super_native_object,"global",dont_delete|dont_enum|read_only,
             native_object::
             add_native_property<mjs::regexp_object,_&mjs::regexp_object::get_global,_nullptr>::
             anon_class_1_0_00000001::__invoke,(put_func)0x0);
  native_object::do_add_native_property
            (&this->super_native_object,"ignoreCase",dont_delete|dont_enum|read_only,
             native_object::
             add_native_property<mjs::regexp_object,_&mjs::regexp_object::get_ignoreCase,_nullptr>::
             anon_class_1_0_00000001::__invoke,(put_func)0x0);
  native_object::do_add_native_property
            (&this->super_native_object,"multiline",dont_delete|dont_enum|read_only,
             native_object::
             add_native_property<mjs::regexp_object,_&mjs::regexp_object::get_multiline,_nullptr>::
             anon_class_1_0_00000001::__invoke,(put_func)0x0);
  native_object::do_add_native_property
            (&this->super_native_object,"lastIndex",dont_delete|dont_enum,
             native_object::
             add_native_property<mjs::regexp_object,_&mjs::regexp_object::get_lastIndex,_&mjs::regexp_object::put_lastIndex>
             ::anon_class_1_0_00000001::__invoke,
             native_object::
             add_native_property<mjs::regexp_object,_&mjs::regexp_object::get_lastIndex,_&mjs::regexp_object::put_lastIndex>
             ::anon_class_1_0_00000001::__invoke);
  return;
}

Assistant:

explicit regexp_object(const gc_heap_ptr<global_object>& global, const object_ptr& prototype, const string& source, regexp_flag flags)
        : native_object(global->common_string("RegExp"), prototype)
        , global_(global)
        , source_(source.unsafe_raw_get())
        , last_index_(value_representation{0.0})
        , flags_(flags) {
        DEFINE_NATIVE_PROPERTY_READONLY(regexp_object, source);
        DEFINE_NATIVE_PROPERTY_READONLY(regexp_object, global);
        DEFINE_NATIVE_PROPERTY_READONLY(regexp_object, ignoreCase);
        DEFINE_NATIVE_PROPERTY_READONLY(regexp_object, multiline);
        DEFINE_NATIVE_PROPERTY(regexp_object, lastIndex);
    }